

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2coords.cc
# Opt level: O0

S2Point * S2::FaceXYZtoUVW(S2Point *__return_storage_ptr__,int face,S2Point *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  S2Point *p_local;
  int face_local;
  
  switch(face) {
  case 0:
    dVar1 = Vector3<double>::y(p);
    dVar2 = Vector3<double>::z(p);
    dVar3 = Vector3<double>::x(p);
    Vector3<double>::Vector3(__return_storage_ptr__,dVar1,dVar2,dVar3);
    break;
  case 1:
    dVar1 = Vector3<double>::x(p);
    dVar2 = Vector3<double>::z(p);
    dVar3 = Vector3<double>::y(p);
    Vector3<double>::Vector3(__return_storage_ptr__,-dVar1,dVar2,dVar3);
    break;
  case 2:
    dVar1 = Vector3<double>::x(p);
    dVar2 = Vector3<double>::y(p);
    dVar3 = Vector3<double>::z(p);
    Vector3<double>::Vector3(__return_storage_ptr__,-dVar1,-dVar2,dVar3);
    break;
  case 3:
    dVar1 = Vector3<double>::z(p);
    dVar2 = Vector3<double>::y(p);
    dVar3 = Vector3<double>::x(p);
    Vector3<double>::Vector3(__return_storage_ptr__,-dVar1,-dVar2,-dVar3);
    break;
  case 4:
    dVar1 = Vector3<double>::z(p);
    dVar2 = Vector3<double>::x(p);
    dVar3 = Vector3<double>::y(p);
    Vector3<double>::Vector3(__return_storage_ptr__,-dVar1,dVar2,-dVar3);
    break;
  default:
    dVar1 = Vector3<double>::y(p);
    dVar2 = Vector3<double>::x(p);
    dVar3 = Vector3<double>::z(p);
    Vector3<double>::Vector3(__return_storage_ptr__,dVar1,dVar2,-dVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

S2Point FaceXYZtoUVW(int face, const S2Point& p) {
  // The result coordinates are simply the dot products of P with the (u,v,w)
  // axes for the given face (see kFaceUVWAxes).
  switch (face) {
    case 0:  return S2Point( p.y(),  p.z(),  p.x());
    case 1:  return S2Point(-p.x(),  p.z(),  p.y());
    case 2:  return S2Point(-p.x(), -p.y(),  p.z());
    case 3:  return S2Point(-p.z(), -p.y(), -p.x());
    case 4:  return S2Point(-p.z(),  p.x(), -p.y());
    default: return S2Point( p.y(),  p.x(), -p.z());
  }
}